

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<cfgfile::file_format_t,cfgfile::file_format_t>
          (String *__return_storage_ptr__,detail *this,file_format_t *lhs,char *op,
          file_format_t *rhs)

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toString<cfgfile::file_format_t,_true>(&local_48,(file_format_t *)this);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  toString<cfgfile::file_format_t,_true>(&SStack_78,(file_format_t *)op);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }